

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffeqtyll(fitsfile *fptr,int colnum,int *typecode,LONGLONG *repeat,LONGLONG *width,int *status)

{
  double dVar1;
  double dVar2;
  tcolumn *ptVar3;
  int iVar4;
  LONGLONG LVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int hdutype;
  long tmpwidth;
  int decims;
  int local_44;
  LONGLONG local_40;
  int local_34;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_0017f0f9;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar3 = fptr->Fptr->tableptr;
  iVar4 = ffghdt(fptr,&local_44,status);
  if (0 < iVar4) goto LAB_0017f0f9;
  if (local_44 == 1) {
    ffasfm(ptVar3[(ulong)(uint)colnum - 1].tform,typecode,&local_40,&local_34,status);
    if (width != (LONGLONG *)0x0) {
      *width = local_40;
    }
    LVar5 = 1;
    if (repeat != (LONGLONG *)0x0) {
LAB_0017f165:
      *repeat = LVar5;
    }
  }
  else {
    if (typecode != (int *)0x0) {
      *typecode = ptVar3[(ulong)(uint)colnum - 1].tdatatype;
    }
    if (width != (LONGLONG *)0x0) {
      *width = ptVar3[(ulong)(uint)colnum - 1].twidth;
    }
    if (repeat != (LONGLONG *)0x0) {
      LVar5 = ptVar3[(ulong)(uint)colnum - 1].trepeat;
      goto LAB_0017f165;
    }
  }
  if (typecode == (int *)0x0) goto LAB_0017f0f9;
  dVar1 = ptVar3[(ulong)(uint)colnum - 1].tscale;
  dVar2 = ptVar3[(ulong)(uint)colnum - 1].tzero;
  if ((((dVar1 == 1.0) && (!NAN(dVar1))) && (dVar2 == 0.0)) && (!NAN(dVar2))) goto LAB_0017f0f9;
  iVar4 = *typecode;
  iVar6 = -iVar4;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  if (iVar6 < 0x29) {
    if (iVar6 == 0xb) {
      dVar8 = 255.0;
      dVar9 = 0.0;
    }
    else {
      if (iVar6 != 0x15) goto LAB_0017f0f9;
      dVar8 = 32767.0;
      dVar9 = -32768.0;
    }
  }
  else if (iVar6 == 0x29) {
    dVar8 = 2147483647.0;
    dVar9 = -2147483648.0;
  }
  else {
    if (iVar6 != 0x51) goto LAB_0017f0f9;
    dVar8 = 9.223372036854776e+18;
    dVar9 = -9.223372036854776e+18;
  }
  dVar10 = dVar9 * dVar1 + dVar2;
  dVar9 = dVar10;
  if (dVar1 < 0.0) {
    dVar9 = dVar1 * dVar10 + dVar2;
  }
  if (((dVar2 == 2147483648.0) && (!NAN(dVar2))) ||
     ((dVar2 == 9.223372036854776e+18 && (!NAN(dVar2))))) {
LAB_0017f284:
    dVar1 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)(dVar8 * dVar1 + dVar2) |
                    (ulong)dVar10 & -(ulong)(dVar1 < 0.0));
    if ((dVar9 == -128.0) && (!NAN(dVar9))) {
      iVar7 = 0xc;
      if ((dVar1 == 127.0) && (!NAN(dVar1))) goto LAB_0017f39c;
    }
    if ((((dVar9 < -32768.0) || (iVar7 = 0x15, 32767.0 < dVar1)) &&
        ((dVar9 < 0.0 || (iVar7 = 0x14, 65535.0 < dVar1)))) &&
       ((((dVar9 < -2147483648.0 || (iVar7 = 0x29, 2147483647.0 < dVar1)) &&
         ((dVar9 < 0.0 || (iVar7 = 0x28, 4294967296.0 <= dVar1)))) &&
        ((dVar9 < -9.223372036854776e+18 || (iVar7 = 0x51, 9.223372036854776e+18 < dVar1)))))) {
      iVar7 = ((byte)~(-(0.0 <= dVar9) & -(dVar1 <= 1.8446744073709552e+19)) & 1) * 2 + 0x50;
    }
  }
  else {
    dVar11 = (double)(-(ulong)(dVar2 < 2147483648.0) & (ulong)(double)(long)dVar2);
    if ((dVar11 == dVar2) && (!NAN(dVar11) && !NAN(dVar2))) {
      if ((dVar1 == (double)(long)dVar1) && (!NAN(dVar1) && !NAN((double)(long)dVar1)))
      goto LAB_0017f284;
    }
    iVar7 = 0x52;
    if (iVar6 == 0xb) {
      iVar7 = 0x2a;
    }
    if (iVar6 == 0x15) {
      iVar7 = 0x2a;
    }
  }
LAB_0017f39c:
  iVar6 = -iVar7;
  if (-1 < iVar4) {
    iVar6 = iVar7;
  }
  *typecode = iVar6;
LAB_0017f0f9:
  return *status;
}

Assistant:

int ffeqtyll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            LONGLONG *repeat,    /* O - repeat count of field                   */
            LONGLONG *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get the 'equivalent' table column type. 

  This routine is similar to the ffgtcl routine (which returns the physical
  datatype of the column, as stored in the FITS file) except that if the
  TSCALn and TZEROn keywords are defined for the column, then it returns
  the 'equivalent' datatype.  Thus, if the column is defined as '1I'  (short
  integer) this routine may return the type as 'TUSHORT' or as 'TFLOAT'
  depending on the TSCALn and TZEROn values.
  
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    tcolumn *colptr;
    int hdutype, decims, tcode, effcode;
    double tscale, tzero, min_val, max_val;
    long lngscale, lngzero = 0, tmpwidth;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum - 1);    /* offset to correct column */

    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == ASCII_TBL)
    {
      ffasfm(colptr->tform, typecode, &tmpwidth, &decims, status);
      if (width)
          *width = tmpwidth;

      if (repeat)
           *repeat = 1;
    }
    else
    {
      if (typecode)
          *typecode = colptr->tdatatype;

      if (width)
          *width = colptr->twidth;

      if (repeat)
          *repeat = colptr->trepeat;
    }

    /* return if caller is not interested in the typecode value */
    if (!typecode)
        return(*status);

    /* check if the tscale and tzero keywords are defined, which might
       change the effective datatype of the column  */

    tscale = colptr->tscale;
    tzero = colptr->tzero;

    if (tscale == 1.0 && tzero == 0.0)  /* no scaling */
        return(*status);
 
    tcode = abs(*typecode);

    switch (tcode)
    {
      case TBYTE:   /* binary table 'rB' column */
        min_val = 0.;
        max_val = 255.0;
        break;

      case TSHORT:
        min_val = -32768.0;
        max_val =  32767.0;
        break;
        
      case TLONG:

        min_val = -2147483648.0;
        max_val =  2147483647.0;
        break;
        
      case TLONGLONG:
        min_val = -9.2233720368547755808E18;
        max_val =  9.2233720368547755807E18;
        break;
	
      default:  /* don't have to deal with other data types */
        return(*status);
    }

    if (tscale >= 0.) {
        min_val = tzero + tscale * min_val;
        max_val = tzero + tscale * max_val;
    } else {
        max_val = tzero + tscale * min_val;
        min_val = tzero + tscale * max_val;
    }
    if (tzero < 2147483648.)  /* don't exceed range of 32-bit integer */
       lngzero = (long) tzero;
    lngscale   = (long) tscale;

    if ((tzero != 2147483648.) && /* special value that exceeds integer range */
        (tzero != 9223372036854775808.) &&  /* indicates unsigned long long */
       (lngzero != tzero || lngscale != tscale)) { /* not integers? */
       /* floating point scaled values; just decide on required precision */
       if (tcode == TBYTE || tcode == TSHORT)
          effcode = TFLOAT;
       else
          effcode = TDOUBLE;

    /*
       In all the remaining cases, TSCALn and TZEROn are integers,
       and not equal to 1 and 0, respectively.  
    */

    } else if ((min_val == -128.) && (max_val == 127.)) {
        effcode = TSBYTE;
 
    } else if ((min_val >= -32768.0) && (max_val <= 32767.0)) {
        effcode = TSHORT;

    } else if ((min_val >= 0.0) && (max_val <= 65535.0)) {
        effcode = TUSHORT;

    } else if ((min_val >= -2147483648.0) && (max_val <= 2147483647.0)) {
        effcode = TLONG;

    } else if ((min_val >= 0.0) && (max_val < 4294967296.0)) {
        effcode = TULONG;

    } else if ((min_val >= -9.2233720368547755808E18) && (max_val <= 9.2233720368547755807E18)) {
        effcode = TLONGLONG;

    } else if ((min_val >= 0.0) && (max_val <= 1.8446744073709551616E19)) {
        effcode = TULONGLONG;

    } else {  /* exceeds the range of a 64-bit integer */
        effcode = TDOUBLE;
    }   

    /* return the effective datatype code (negative if variable length col.) */
    if (*typecode < 0)  /* variable length array column */
        *typecode = -effcode;
    else
        *typecode = effcode;

    return(*status);
}